

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O1

void __thiscall CMU462::Camera::copy_placement(Camera *this,Camera *other)

{
  double dVar1;
  long lVar2;
  Matrix3x3 *pMVar3;
  Matrix3x3 *pMVar4;
  
  (this->pos).z = (other->pos).z;
  dVar1 = (other->pos).y;
  (this->pos).x = (other->pos).x;
  (this->pos).y = dVar1;
  dVar1 = (other->targetPos).y;
  (this->targetPos).x = (other->targetPos).x;
  (this->targetPos).y = dVar1;
  (this->targetPos).z = (other->targetPos).z;
  this->phi = other->phi;
  this->theta = other->theta;
  this->minR = other->minR;
  this->maxR = other->maxR;
  pMVar3 = &other->c2w;
  pMVar4 = &this->c2w;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    pMVar4->entries[0].x = pMVar3->entries[0].x;
    pMVar3 = (Matrix3x3 *)&pMVar3->entries[0].y;
    pMVar4 = (Matrix3x3 *)&pMVar4->entries[0].y;
  }
  return;
}

Assistant:

void Camera::copy_placement(const Camera& other) {
    pos = other.pos;
    targetPos = other.targetPos;
    phi = other.phi;
    theta = other.theta;
    minR = other.minR;
    maxR = other.maxR;
    c2w = other.c2w;
  }